

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall upb::generator::Output::operator()(Output *this,string_view format,char **arg)

{
  Arg *in_R8;
  string_view data;
  string_view format_00;
  string local_70;
  string_view local_50 [3];
  
  format_00._M_len = format._M_str;
  local_50[0] = absl::lts_20240722::NullSafeStringView(*arg);
  format_00._M_str = (char *)local_50;
  absl::lts_20240722::Substitute_abi_cxx11_(&local_70,(lts_20240722 *)format._M_len,format_00,in_R8)
  ;
  data._M_str = local_70._M_dataplus._M_p;
  data._M_len = local_70._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }